

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O1

qsizetype __thiscall QTextBoundaryFinder::toPreviousBoundary(QTextBoundaryFinder *this)

{
  QCharAttributes *pQVar1;
  long lVar2;
  
  pQVar1 = this->attributes;
  if (((pQVar1 == (QCharAttributes *)0x0) || (lVar2 = this->pos, lVar2 < 1)) ||
     ((this->sv).m_size < lVar2)) {
    this->pos = -1;
    return -1;
  }
  this->pos = lVar2 + -1;
  switch(this->t) {
  case Grapheme:
    if (0 < this->pos) {
      lVar2 = this->pos + 1;
      do {
        if (((byte)pQVar1[lVar2 + -1] & 1) != 0) break;
        this->pos = lVar2 + -2;
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
    break;
  case Word:
    if (0 < this->pos) {
      lVar2 = this->pos + 1;
      do {
        if (((byte)pQVar1[lVar2 + -1] & 2) != 0) break;
        this->pos = lVar2 + -2;
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
    break;
  case Sentence:
    if (0 < this->pos) {
      lVar2 = this->pos + 1;
      do {
        if (((byte)pQVar1[lVar2 + -1] & 4) != 0) break;
        this->pos = lVar2 + -2;
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
    break;
  case Line:
    if (0 < this->pos) {
      lVar2 = this->pos + 1;
      do {
        if (((byte)pQVar1[lVar2 + -1] & 8) != 0) break;
        this->pos = lVar2 + -2;
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
  }
  return this->pos;
}

Assistant:

qsizetype QTextBoundaryFinder::toPreviousBoundary()
{
    if (!attributes || pos <= 0 || pos > sv.size()) {
        pos = -1;
        return pos;
    }

    --pos;
    switch(t) {
    case Grapheme:
        while (pos > 0 && !attributes[pos].graphemeBoundary)
            --pos;
        break;
    case Word:
        while (pos > 0 && !attributes[pos].wordBreak)
            --pos;
        break;
    case Sentence:
        while (pos > 0 && !attributes[pos].sentenceBoundary)
            --pos;
        break;
    case Line:
        while (pos > 0 && !attributes[pos].lineBreak)
            --pos;
        break;
    }

    return pos;
}